

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O2

Image * operator-(Image *__return_storage_ptr__,Image *image1,Image *image2)

{
  int **ppiVar1;
  int i;
  long lVar2;
  long lVar3;
  Image result;
  Image local_30;
  
  Image::Image(&local_30,image1);
  for (lVar2 = 0; lVar2 < image1->row; lVar2 = lVar2 + 1) {
    ppiVar1 = image2->matrix;
    for (lVar3 = 0; lVar3 < image1->col; lVar3 = lVar3 + 1) {
      local_30.matrix[lVar2][lVar3] = local_30.matrix[lVar2][lVar3] - ppiVar1[lVar2][lVar3];
    }
  }
  Image::normalize(&local_30);
  Image::Image(__return_storage_ptr__,&local_30);
  Image::~Image(&local_30);
  return __return_storage_ptr__;
}

Assistant:

Image operator-(Image& image1, Image& image2)
{
    Image result = image1.clone();

    for (int i = 0; i < image1.row; ++i) {
        for (int j = 0; j < image1.col; ++j) {
            result.matrix[i][j] -= image2.matrix[i][j];
        }
    }

    return result.normalize();
}